

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O0

Iter<(anonymous_namespace)::ByPeer> __thiscall
TxRequestTracker::Impl::Erase<(anonymous_namespace)::ByPeer>
          (Impl *this,Iter<(anonymous_namespace)::ByPeer> it)

{
  long lVar1;
  State SVar2;
  pointer ppVar3;
  _Node_iterator_base<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false> __position;
  size_t sVar4;
  iterator iVar5;
  ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
  *in_RDI;
  long in_FS_OFFSET;
  iterator peerit;
  Announcement *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
  ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                *)in_stack_ffffffffffffff98);
  std::
  unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
  ::find((unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
          *)in_RDI,(key_type *)in_stack_ffffffffffffff98);
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
  ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                *)in_stack_ffffffffffffff98);
  SVar2 = anon_unknown.dwarf_237ecec::Announcement::GetState(in_stack_ffffffffffffff98);
  iVar5.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                *)(ulong)(SVar2 == COMPLETED);
  ppVar3 = std::__detail::
           _Node_iterator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false,_false>::
           operator->((_Node_iterator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false,_false>
                       *)in_stack_ffffffffffffff98);
  (ppVar3->second).m_completed = (ppVar3->second).m_completed - (long)iVar5.node;
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
  ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                *)in_stack_ffffffffffffff98);
  SVar2 = anon_unknown.dwarf_237ecec::Announcement::GetState(in_stack_ffffffffffffff98);
  __position._M_cur = (__node_type *)(ulong)(SVar2 == REQUESTED);
  ppVar3 = std::__detail::
           _Node_iterator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false,_false>::
           operator->((_Node_iterator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false,_false>
                       *)in_stack_ffffffffffffff98);
  (ppVar3->second).m_requested = (ppVar3->second).m_requested - (long)__position._M_cur;
  ppVar3 = std::__detail::
           _Node_iterator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false,_false>::
           operator->((_Node_iterator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>,_false,_false>
                       *)in_stack_ffffffffffffff98);
  sVar4 = (ppVar3->second).m_total - 1;
  (ppVar3->second).m_total = sVar4;
  if (sVar4 == 0) {
    std::
    unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
    ::erase((unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
             *)in_RDI,(iterator)__position._M_cur);
  }
  boost::multi_index::
  multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
  ::get<(anonymous_namespace)::ByPeer>
            ((multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
              *)in_stack_ffffffffffffff98);
  iVar5 = boost::multi_index::detail::
          ordered_index_impl<(anonymous_namespace)::ByPeerViewExtractor,_std::less<std::tuple<long,_bool,_const_uint256_&>_>,_boost::multi_index::detail::nth_layer<1,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByPeer,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::erase(in_RDI,iVar5);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Iter<(anonymous_namespace)::ByPeer>)iVar5.node;
  }
  __stack_chk_fail();
}

Assistant:

Iter<Tag> Erase(Iter<Tag> it)
    {
        auto peerit = m_peerinfo.find(it->m_peer);
        peerit->second.m_completed -= it->GetState() == State::COMPLETED;
        peerit->second.m_requested -= it->GetState() == State::REQUESTED;
        if (--peerit->second.m_total == 0) m_peerinfo.erase(peerit);
        return m_index.get<Tag>().erase(it);
    }